

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O2

PSocket * p_socket_new_from_fd(pint fd,PError **error)

{
  int iVar1;
  PSocketFamily PVar2;
  uint uVar3;
  pboolean pVar4;
  pint pVar5;
  PErrorIO code;
  PSocket *mem;
  PSocketType PVar6;
  char *pcVar7;
  PError **extraout_RDX;
  PError **extraout_RDX_00;
  PError **ppPVar8;
  socklen_t optlen;
  socklen_t addrlen;
  int local_a4;
  pint value;
  PSocketFamily family;
  sockaddr_storage address;
  
  if (fd < 0) {
    pcVar7 = "Unable to create socket from bad fd";
    pVar5 = 0x1fb;
LAB_0011201e:
    p_error_set_error_p(error,pVar5,0,pcVar7);
    return (PSocket *)0x0;
  }
  mem = (PSocket *)p_malloc0(0x1c);
  if (mem == (PSocket *)0x0) {
    pcVar7 = "Failed to allocate memory for socket";
    pVar5 = 0x1f5;
    goto LAB_0011201e;
  }
  mem->fd = fd;
  optlen = 4;
  iVar1 = getsockopt(fd,1,3,&value,&optlen);
  if (iVar1 == 0) {
    if (optlen == 4) {
      PVar6 = P_SOCKET_TYPE_UNKNOWN;
      if (value - 1U < 5) {
        PVar6 = *(PSocketType *)(&DAT_0011840c + (ulong)(value - 1U) * 4);
      }
      mem->type = PVar6;
      addrlen = 0x80;
      iVar1 = getsockname(fd,(sockaddr *)&address,&addrlen);
      if (iVar1 == 0) {
        if (addrlen == 0) {
          optlen = 4;
          iVar1 = getsockopt(mem->fd,1,0x27,&family,&optlen);
          if (iVar1 != 0) {
            pVar5 = p_error_get_last_net();
            code = p_error_get_io_from_system(pVar5);
            pVar5 = p_error_get_last_net();
            pcVar7 = "Failed to call getsockopt() to get socket SO_DOMAIN option";
            goto LAB_00112093;
          }
        }
        PVar2 = (PSocketFamily)address.ss_family;
        if (address.ss_family == 2) {
LAB_00111f29:
          mem->family = PVar2;
          uVar3 = mem->type - P_SOCKET_TYPE_STREAM;
          if (uVar3 < 3) {
            mem->protocol = *(PSocketProtocol *)(&DAT_00118420 + (ulong)uVar3 * 4);
          }
          addrlen = 0x80;
          iVar1 = getpeername(fd,(sockaddr *)&address,&addrlen);
          if (-1 < iVar1) {
            mem->field_0x18 = mem->field_0x18 | 8;
          }
        }
        else {
          if (address.ss_family == 10) {
            PVar2 = P_SOCKET_FAMILY_INET6;
            goto LAB_00111f29;
          }
          mem->family = P_SOCKET_FAMILY_UNKNOWN;
        }
        optlen = 4;
        iVar1 = getsockopt(fd,1,9,&local_a4,&optlen);
        ppPVar8 = extraout_RDX;
        if (iVar1 == 0) {
          if (optlen != 4) {
            printf("** Warning: %s **\n",
                   "PSocket::pp_socket_set_details_from_fd: getsockopt() with SO_KEEPALIVE failed");
            ppPVar8 = extraout_RDX_00;
          }
          mem->field_0x18 = mem->field_0x18 & 0xfd | (local_a4 != 0) * '\x02';
        }
        else {
          mem->field_0x18 = mem->field_0x18 & 0xfd;
        }
        pVar4 = pp_socket_set_fd_blocking(mem->fd,(pboolean)error,ppPVar8);
        if (pVar4 != 0) {
          if ((mem->field_0x18 & 0x10) == 0) {
            mem->listen_backlog = 5;
          }
          mem->timeout = 0;
          mem->field_0x18 = mem->field_0x18 | 1;
          return mem;
        }
        goto LAB_00112098;
      }
      pVar5 = p_error_get_last_net();
      code = p_error_get_io_from_system(pVar5);
      pVar5 = p_error_get_last_net();
      pcVar7 = "Failed to call getsockname() to get socket address info";
    }
    else {
      pcVar7 = "Failed to get socket info for fd, bad option length";
      code = P_ERROR_IO_INVALID_ARGUMENT;
      pVar5 = 0;
    }
  }
  else {
    pVar5 = p_error_get_last_net();
    code = p_error_get_io_from_system(pVar5);
    pVar5 = p_error_get_last_net();
    pcVar7 = "Failed to call getsockopt() to get socket info for fd";
  }
LAB_00112093:
  p_error_set_error_p(error,code,pVar5,pcVar7);
LAB_00112098:
  p_free(mem);
  return (PSocket *)0x0;
}

Assistant:

P_LIB_API PSocket *
p_socket_new_from_fd (pint	fd,
		      PError	**error)
{
	PSocket	*ret;
#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	pint	flags;
#endif

	if (P_UNLIKELY (fd < 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Unable to create socket from bad fd");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocket))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for socket");
		return NULL;
	}

	ret->fd = fd;

	if (P_UNLIKELY (pp_socket_set_details_from_fd (ret, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

	if (P_UNLIKELY (pp_socket_set_fd_blocking (ret->fd, FALSE, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	flags = 1;

	if (setsockopt (ret->fd, SOL_SOCKET, SO_NOSIGPIPE, &flags, sizeof (flags)) < 0)
		P_WARNING ("PSocket::p_socket_new_from_fd: setsockopt() with SO_NOSIGPIPE failed");
#endif

	p_socket_set_listen_backlog (ret, P_SOCKET_DEFAULT_BACKLOG);

	ret->timeout  = 0;
	ret->blocking = TRUE;

#ifdef P_OS_SCO
	if (P_UNLIKELY ((ret->timer = p_time_profiler_new ()) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for internal timer");
		p_free (ret);
		return NULL;
	}
#endif

#ifdef P_OS_WIN
	if (P_UNLIKELY ((ret->events = WSACreateEvent ()) == WSA_INVALID_EVENT)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     (pint) p_error_get_last_net (),
				     "Failed to call WSACreateEvent() on socket");
		p_free (ret);
		return NULL;
	}
#endif

	return ret;
}